

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall spvtools::opt::Function::ReorderBasicBlocksInStructuredOrder(Function *this)

{
  pointer this_00;
  IRContext *this_01;
  CFG *this_02;
  reference this_03;
  pointer root;
  iterator begin;
  iterator end;
  IRContext *context;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  Function *this_local;
  
  order.super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl._M_node._M_size = (size_t)this;
  std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)&context);
  this_00 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator->(&this->def_inst_);
  this_01 = Instruction::context(this_00);
  this_02 = IRContext::cfg(this_01);
  this_03 = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::operator[](&this->blocks_,0);
  root = std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ::get(this_03);
  CFG::ComputeStructuredOrder
            (this_02,this,root,
             (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &context);
  begin = std::__cxx11::
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::begin
                    ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)&context);
  end = std::__cxx11::
        list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                  ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&context);
  ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>
            (this,(_List_iterator<spvtools::opt::BasicBlock_*>)begin._M_node,
             (_List_iterator<spvtools::opt::BasicBlock_*>)end._M_node);
  std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)&context)
  ;
  return;
}

Assistant:

void Function::ReorderBasicBlocksInStructuredOrder() {
  std::list<BasicBlock*> order;
  IRContext* context = this->def_inst_->context();
  context->cfg()->ComputeStructuredOrder(this, blocks_[0].get(), &order);
  ReorderBasicBlocks(order.begin(), order.end());
}